

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_TestOutput_PrintInVisualStudioFormat_Test::TEST_TestOutput_PrintInVisualStudioFormat_Test
          (TEST_TestOutput_PrintInVisualStudioFormat_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).f3 = (TestFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).f = (TestFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).f2 = (TestFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).mock = (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).tst = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).printer = (TestOutput *)0x0;
  TEST_GROUP_CppUTestGroupTestOutput::TEST_GROUP_CppUTestGroupTestOutput
            (&this->super_TEST_GROUP_CppUTestGroupTestOutput);
  (this->super_TEST_GROUP_CppUTestGroupTestOutput).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00375a00;
  return;
}

Assistant:

TEST(TestOutput, PrintInVisualStudioFormat)
{
    TestOutput::setWorkingEnvironment(TestOutput::visualStudio);
    printer->printFailure(*f3);
    const char* expected =
            "\nfile(10): error: Failure in TEST(group, test)"
            "\nfile(2): error:\n\tmessage\n\n";
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}